

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<int> * __thiscall
VW::config::typed_option<int>::default_value(typed_option<int> *this,int value)

{
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<int,int&>((int *)&local_20);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_default_value).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& default_value(T value)
  {
    m_default_value = std::make_shared<T>(value);
    return *this;
  }